

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O1

void Cffgprh(fitsfile *fptr,int *simple,int *bitpix,int *naxis,int *naxes,long *pcount,long *gcount,
            int *extend,int *status)

{
  long *naxes_00;
  long lVar1;
  long lVar2;
  long size;
  
  ffgkyj(fptr,"NAXIS",&size,(char *)0x0,status);
  lVar2 = size;
  naxes_00 = (long *)malloc(size * 8);
  if (0 < lVar2) {
    lVar1 = 0;
    do {
      naxes_00[lVar1] = (long)naxes[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar2 != lVar1);
  }
  ffghpr(fptr,(int)lVar2,simple,bitpix,naxis,naxes_00,pcount,gcount,extend,status);
  if (0 < size) {
    lVar2 = 0;
    do {
      naxes[lVar2] = (int)naxes_00[lVar2];
      lVar2 = lVar2 + 1;
    } while (size != lVar2);
  }
  free(naxes_00);
  return;
}

Assistant:

void Cffgprh( fitsfile *fptr, int *simple, int *bitpix, int *naxis, int naxes[],
             long *pcount, long *gcount, int *extend, int *status )
{
   long *LONGnaxes, size;

   ffgkyj( fptr, "NAXIS", &size, 0, status );
   LONGnaxes = F2Clongv(size,naxes);
   ffghpr( fptr, (int)size, simple, bitpix, naxis, LONGnaxes,
           pcount, gcount, extend, status );
   C2Flongv(size,naxes,LONGnaxes);
}